

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::ComputeLinkClosure
          (cmGeneratorTarget *this,string *config,LinkClosure *lc,bool secondPass)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pcVar3;
  LinkClosure *pLVar4;
  bool bVar5;
  long *plVar6;
  size_type *psVar7;
  cmLinkImplItem *lib;
  pointer item;
  pointer pbVar8;
  __node_base _Var9;
  cmLinkImplementation *pcVar10;
  string propagates;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  cmTargetSelectLinker tsl;
  cmTargetCollectLinkLanguages cll;
  string local_188;
  cmLinkImplementation *local_168;
  LinkClosure *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_118;
  cmTargetSelectLinker local_e0;
  undefined1 local_98 [48];
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_68;
  bool local_37;
  
  local_118._M_buckets = &local_118._M_single_bucket;
  local_118._M_bucket_count = 1;
  local_118._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_118._M_element_count = 0;
  local_118._M_rehash_policy._M_max_load_factor = 1.0;
  local_118._M_rehash_policy._M_next_resize = 0;
  local_118._M_single_bucket = (__node_base_ptr)0x0;
  local_168 = GetLinkImplementation(this,config,Link,secondPass);
  local_160 = lc;
  if (local_168 != (cmLinkImplementation *)0x0) {
    pbVar8 = (local_168->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (local_168->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_98._0_8_ = &local_118;
    if (pbVar8 != pbVar1) {
      do {
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_118,pbVar8,local_98);
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != pbVar1);
    }
    pcVar2 = (config->_M_dataplus)._M_p;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,pcVar2,pcVar2 + config->_M_string_length);
    cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
              ((cmTargetCollectLinkLanguages *)local_98,this,&local_138,
               (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_118,this,secondPass);
    pLVar4 = local_160;
    pcVar10 = local_168;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    item = (pcVar10->super_cmLinkImplementationLibraries).Libraries.
           super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
           super__Vector_impl_data._M_start;
    pcVar3 = (pcVar10->super_cmLinkImplementationLibraries).Libraries.
             super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (item != pcVar3) {
      do {
        cmTargetCollectLinkLanguages::Visit
                  ((cmTargetCollectLinkLanguages *)local_98,&item->super_cmLinkItem);
        item = item + 1;
      } while (item != pcVar3);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<std::__detail::_Node_const_iterator<std::__cxx11::string,true,true>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &pLVar4->Languages,
               (pLVar4->Languages).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,local_118._M_before_begin._M_nxt,0);
    if ((secondPass) || ((pLVar4->LinkerLanguage)._M_string_length == 0)) {
      local_e0.Preferred._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_e0.Preferred._M_t._M_impl.super__Rb_tree_header._M_header;
      local_e0.Preference = 0;
      local_e0.Preferred._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_e0.Preferred._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e0.Preferred._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_e0.GG = this->LocalGenerator->GlobalGenerator;
      pbVar8 = (pcVar10->Languages).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (pcVar10->Languages).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_e0.Target = this;
      local_e0.Preferred._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_e0.Preferred._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (pbVar8 != pbVar1) {
        do {
          cmTargetSelectLinker::Consider(&local_e0,pbVar8);
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != pbVar1);
      }
      if (local_118._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        _Var9._M_nxt = local_118._M_before_begin._M_nxt;
        do {
          std::operator+(&local_158,"CMAKE_",(string *)(_Var9._M_nxt + 1));
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
          psVar7 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_188.field_2._M_allocated_capacity = *psVar7;
            local_188.field_2._8_8_ = plVar6[3];
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar7;
            local_188._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_188._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          bVar5 = cmMakefile::IsOn(this->Makefile,&local_188);
          if (bVar5) {
            cmTargetSelectLinker::Consider(&local_e0,(string *)(_Var9._M_nxt + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt;
        } while (_Var9._M_nxt != (_Hash_node_base *)0x0);
      }
      cmTargetSelectLinker::Choose_abi_cxx11_(&local_188,&local_e0);
      std::__cxx11::string::operator=((string *)local_160,(string *)&local_188);
      pcVar10 = local_168;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_e0.Preferred._M_t);
    }
    bVar5 = pcVar10->HadLinkLanguageSensitiveCondition;
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 *)(local_98 + 0x30));
    if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
         *)local_98._0_8_ !=
        (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
         *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_118);
    return (bool)((bVar5 | local_37) & 1);
  }
  __assert_fail("impl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0xb1d,
                "bool cmGeneratorTarget::ComputeLinkClosure(const std::string &, LinkClosure &, bool) const"
               );
}

Assistant:

bool cmGeneratorTarget::ComputeLinkClosure(const std::string& config,
                                           LinkClosure& lc,
                                           bool secondPass) const
{
  // Get languages built in this target.
  std::unordered_set<std::string> languages;
  cmLinkImplementation const* impl =
    this->GetLinkImplementation(config, LinkInterfaceFor::Link, secondPass);
  assert(impl);
  languages.insert(impl->Languages.cbegin(), impl->Languages.cend());

  // Add interface languages from linked targets.
  // cmTargetCollectLinkLanguages cll(this, config, languages, this,
  // secondPass);
  cmTargetCollectLinkLanguages cll(this, config, languages, this, secondPass);
  for (cmLinkImplItem const& lib : impl->Libraries) {
    cll.Visit(lib);
  }

  // Store the transitive closure of languages.
  cm::append(lc.Languages, languages);

  // Choose the language whose linker should be used.
  if (secondPass || lc.LinkerLanguage.empty()) {
    // Find the language with the highest preference value.
    cmTargetSelectLinker tsl(this);

    // First select from the languages compiled directly in this target.
    for (std::string const& l : impl->Languages) {
      tsl.Consider(l);
    }

    // Now consider languages that propagate from linked targets.
    for (std::string const& lang : languages) {
      std::string propagates =
        "CMAKE_" + lang + "_LINKER_PREFERENCE_PROPAGATES";
      if (this->Makefile->IsOn(propagates)) {
        tsl.Consider(lang);
      }
    }

    lc.LinkerLanguage = tsl.Choose();
  }

  return impl->HadLinkLanguageSensitiveCondition ||
    cll.GetHadLinkLanguageSensitiveCondition();
}